

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O0

void __thiscall
JsUtil::
BaseDictionary<JsUtil::Pair<unsigned_int,_int,_DefaultComparer>,_PropertySym_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::Initialize(BaseDictionary<JsUtil::Pair<unsigned_int,_int,_DefaultComparer>,_PropertySym_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             *this,int capacity)

{
  code *pcVar1;
  bool bVar2;
  uint *puVar3;
  undefined4 *puVar4;
  char *name;
  DictionaryStats *pDVar5;
  EntryType *local_38;
  EntryType *newEntries;
  int *newBuckets;
  int local_20;
  uint initBucketCount;
  int modIndex;
  int local_14;
  int initSize;
  int capacity_local;
  BaseDictionary<JsUtil::Pair<unsigned_int,_int,_DefaultComparer>,_PropertySym_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_local;
  
  initBucketCount = 4;
  local_14 = capacity;
  _initSize = this;
  puVar3 = (uint *)max<int>(&local_14,(int *)&initBucketCount);
  modIndex = *puVar3;
  local_20 = 0x4b;
  newBuckets._4_4_ =
       DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>::GetBucketSize(modIndex,&local_20);
  if (newBuckets._4_4_ == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                       ,0x380,"(initBucketCount > 0)",
                       "Size returned by policy should be greater than 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  newEntries = (EntryType *)0x0;
  local_38 = (Type)0x0;
  Allocate(this,(int **)&newEntries,&local_38,newBuckets._4_4_,modIndex);
  this->buckets = (Type)newEntries;
  this->entries = local_38;
  this->bucketCount = newBuckets._4_4_;
  this->size = modIndex;
  this->modFunctionIndex = local_20;
  if (this->freeCount != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                       ,0x38c,"(this->freeCount == 0)","this->freeCount == 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  name = std::type_info::name
                   ((type_info *)
                    &BaseDictionary<JsUtil::Pair<unsigned_int,int,DefaultComparer>,PropertySym*,Memory::JitArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>*
                     ::typeinfo);
  pDVar5 = DictionaryStats::Create(name,this->size);
  this->stats = pDVar5;
  return;
}

Assistant:

void Initialize(int capacity)
        {
            // minimum capacity is 4
            int initSize = max(capacity, 4);
            int modIndex = UNKNOWN_MOD_INDEX;
            uint initBucketCount = SizePolicy::GetBucketSize(initSize, &modIndex);
            AssertMsg(initBucketCount > 0, "Size returned by policy should be greater than 0");

            int* newBuckets = nullptr;
            EntryType* newEntries = nullptr;
            Allocate(&newBuckets, &newEntries, initBucketCount, initSize);

            // Allocation can throw - assign only after allocation has succeeded.
            this->buckets = newBuckets;
            this->entries = newEntries;
            this->bucketCount = initBucketCount;
            this->size = initSize;
            this->modFunctionIndex = modIndex;
            Assert(this->freeCount == 0);
#if PROFILE_DICTIONARY
            stats = DictionaryStats::Create(typeid(this).name(), size);
#endif
        }